

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_buffer.cpp
# Opt level: O2

bool dxil_spv::emit_physical_buffer_load_instruction
               (Impl *impl,CallInst *instruction,PhysicalPointerMeta *ptr_meta,uint32_t mask,
               uint32_t alignment)

{
  uint uVar1;
  Builder *this;
  bool bVar2;
  uint8_t uVar3;
  Id IVar4;
  uint uVar5;
  Id IVar6;
  Id arg;
  Type *pTVar7;
  Value *value;
  Operation *pOVar8;
  Operation *this_00;
  mapped_type *pmVar9;
  LoggingCallback p_Var10;
  void *pvVar11;
  uint32_t uVar12;
  Id physical_type_id;
  uint32_t mask_local;
  uint32_t local_106c;
  Op value_cast_op;
  uint32_t alignment_local;
  Builder *local_1060;
  uint local_1054;
  Type *local_1050;
  PhysicalPointerMeta *local_1048;
  CallInst *local_1040;
  PhysicalPointerMeta tmp_ptr_meta;
  
  mask_local = mask;
  alignment_local = alignment;
  local_1048 = ptr_meta;
  local_1060 = Converter::Impl::builder(impl);
  if (((mask == 0) &&
      (bVar2 = get_constant_operand(&instruction->super_Instruction,4,&mask_local), !bVar2)) ||
     ((alignment == 0 &&
      (bVar2 = get_constant_operand(&instruction->super_Instruction,5,&alignment_local), !bVar2))))
  {
    bVar2 = false;
  }
  else {
    uVar12 = mask_local;
    if (mask_local == 1) {
      uVar1 = 1;
    }
    else if (mask_local == 3) {
      uVar1 = 2;
    }
    else if (mask_local == 0xf) {
      uVar1 = 4;
    }
    else {
      if (mask_local != 7) {
        p_Var10 = get_thread_log_callback();
        if (p_Var10 != (LoggingCallback)0x0) {
          snprintf(&tmp_ptr_meta.nonwritable,0x1000,"Unexpected mask for RawBufferLoad = %u.\n",
                   (ulong)mask_local);
          pvVar11 = get_thread_log_callback_userdata();
          (*p_Var10)(pvVar11,Error,&tmp_ptr_meta.nonwritable);
          return false;
        }
        fprintf(_stderr,"[ERROR]: Unexpected mask for RawBufferLoad = %u.\n",(ulong)mask_local);
        fflush(_stderr);
        return false;
      }
      uVar1 = 3;
    }
    pTVar7 = LLVMBC::Value::getType((Value *)instruction);
    pTVar7 = LLVMBC::Type::getStructElementType(pTVar7,0);
    IVar4 = build_vectorized_physical_load_store_access(impl,instruction,uVar1,pTVar7);
    local_1050 = pTVar7;
    get_physical_load_store_cast_info(impl,pTVar7,&physical_type_id,&value_cast_op);
    if (uVar12 != 1) {
      physical_type_id = spv::Builder::makeVectorType(local_1060,physical_type_id,uVar1);
    }
    tmp_ptr_meta.size = local_1048->size;
    tmp_ptr_meta.nonwritable = local_1048->nonwritable;
    tmp_ptr_meta.nonreadable = local_1048->nonreadable;
    tmp_ptr_meta.coherent = local_1048->coherent;
    tmp_ptr_meta.rov = local_1048->rov;
    tmp_ptr_meta.stride = local_1048->stride;
    tmp_ptr_meta._5_3_ = *(undefined3 *)&local_1048->field_0x5;
    if (IVar4 == 0) {
      uVar3 = '\0';
    }
    else {
      uVar5 = get_type_scalar_alignment(impl,local_1050);
      uVar3 = (char)uVar5 * (char)uVar1;
    }
    local_106c = uVar12;
    tmp_ptr_meta.stride = uVar3;
    IVar6 = Converter::Impl::get_physical_pointer_block_type(impl,physical_type_id,&tmp_ptr_meta);
    local_1054 = uVar1;
    if (IVar4 == 0) {
      arg = build_physical_pointer_address_for_raw_load_store(impl,instruction);
    }
    else {
      value = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
      arg = Converter::Impl::get_id_for_value(impl,value,0);
    }
    emit_buffer_synchronization_validation(impl,instruction,Load);
    pOVar8 = Converter::Impl::allocate(impl,OpBitcast,IVar6);
    Operation::add_id(pOVar8,arg);
    Converter::Impl::add(impl,pOVar8,false);
    this = local_1060;
    IVar6 = spv::Builder::makePointer(local_1060,StorageClassPhysicalStorageBuffer,physical_type_id)
    ;
    this_00 = Converter::Impl::allocate(impl,OpInBoundsAccessChain,IVar6);
    Operation::add_id(this_00,pOVar8->id);
    IVar6 = spv::Builder::makeUintConstant(this,0,false);
    Operation::add_id(this_00,IVar6);
    if (IVar4 != 0) {
      Operation::add_id(this_00,IVar4);
    }
    Converter::Impl::add(impl,this_00,false);
    pOVar8 = Converter::Impl::allocate(impl,OpLoad,physical_type_id);
    Operation::add_id(pOVar8,this_00->id);
    Operation::add_literal(pOVar8,2);
    Operation::add_literal(pOVar8,alignment_local);
    Converter::Impl::add(impl,pOVar8,local_1048->rov);
    uVar1 = local_1054;
    IVar4 = pOVar8->id;
    uVar12 = local_106c;
    if (value_cast_op != OpNop) {
      IVar6 = Converter::Impl::get_type_id(impl,local_1050,0);
      uVar12 = local_106c;
      if (local_106c != 1) {
        IVar6 = spv::Builder::makeVectorType(local_1060,IVar6,uVar1);
      }
      pOVar8 = Converter::Impl::allocate(impl,value_cast_op,IVar6);
      Operation::add_id(pOVar8,IVar4);
      Converter::Impl::add(impl,pOVar8,false);
      IVar4 = pOVar8->id;
    }
    Converter::Impl::rewrite_value(impl,(Value *)instruction,IVar4);
    if (uVar12 == 1) {
      local_1040 = instruction;
      pmVar9 = std::__detail::
               _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&impl->llvm_composite_meta,(key_type *)&local_1040);
      pmVar9->forced_composite = false;
    }
    build_exploded_composite_from_vector(impl,&instruction->super_Instruction,uVar1);
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

static bool emit_physical_buffer_load_instruction(Converter::Impl &impl, const llvm::CallInst *instruction,
                                                  const Converter::Impl::PhysicalPointerMeta &ptr_meta,
                                                  uint32_t mask = 0, uint32_t alignment = 0)
{
	auto &builder = impl.builder();

	if (mask == 0 && !get_constant_operand(instruction, 4, &mask))
		return false;
	if (alignment == 0 && !get_constant_operand(instruction, 5, &alignment))
		return false;

	unsigned vecsize = 0;
	if (mask == 1)
		vecsize = 1;
	else if (mask == 3)
		vecsize = 2;
	else if (mask == 7)
		vecsize = 3;
	else if (mask == 15)
		vecsize = 4;
	else
	{
		LOGE("Unexpected mask for RawBufferLoad = %u.\n", mask);
		return false;
	}

	auto *element_type = instruction->getType()->getStructElementType(0);
	// If we can express this as a plain access chain, do so for clarity and ideally better perf.
	// If we cannot do it trivially, fallback to raw pointer arithmetic.
	spv::Id array_id = build_vectorized_physical_load_store_access(impl, instruction, vecsize, element_type);

	spv::Id physical_type_id;
	spv::Op value_cast_op;
	get_physical_load_store_cast_info(impl, element_type, physical_type_id, value_cast_op);

	if (vecsize > 1)
		physical_type_id = builder.makeVectorType(physical_type_id, vecsize);

	auto tmp_ptr_meta = ptr_meta;
	tmp_ptr_meta.stride = array_id ? vecsize * get_type_scalar_alignment(impl, element_type) : 0;
	spv::Id ptr_type_id = impl.get_physical_pointer_block_type(physical_type_id, tmp_ptr_meta);

	spv::Id u64_ptr_id;
	if (array_id)
		u64_ptr_id = impl.get_id_for_value(instruction->getOperand(1));
	else
		u64_ptr_id = build_physical_pointer_address_for_raw_load_store(impl, instruction);

	emit_buffer_synchronization_validation(impl, instruction, BDAOperation::Load);

	auto *ptr_bitcast_op = impl.allocate(spv::OpBitcast, ptr_type_id);
	ptr_bitcast_op->add_id(u64_ptr_id);
	impl.add(ptr_bitcast_op);

	auto *chain_op = impl.allocate(spv::OpInBoundsAccessChain,
								   builder.makePointer(spv::StorageClassPhysicalStorageBuffer, physical_type_id));
	chain_op->add_id(ptr_bitcast_op->id);
	chain_op->add_id(builder.makeUintConstant(0));
	if (array_id)
		chain_op->add_id(array_id);
	impl.add(chain_op);

	auto *load_op = impl.allocate(spv::OpLoad, physical_type_id);
	load_op->add_id(chain_op->id);
	load_op->add_literal(spv::MemoryAccessAlignedMask);
	load_op->add_literal(alignment);

	impl.add(load_op, ptr_meta.rov);

	spv::Id loaded_id = load_op->id;

	if (value_cast_op != spv::OpNop)
	{
		spv::Id type_id = impl.get_type_id(element_type);
		if (vecsize > 1)
			type_id = builder.makeVectorType(type_id, vecsize);
		auto *cast_op = impl.allocate(value_cast_op, type_id);
		cast_op->add_id(loaded_id);
		impl.add(cast_op);
		loaded_id = cast_op->id;
	}

	impl.rewrite_value(instruction, loaded_id);

	if (vecsize == 1)
		impl.llvm_composite_meta[instruction].forced_composite = false;

	build_exploded_composite_from_vector(impl, instruction, vecsize);

	return true;
}